

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_binder.cpp
# Opt level: O3

void __thiscall
duckdb::CheckBinder::CheckBinder
          (CheckBinder *this,Binder *binder,ClientContext *context,string *table_p,
          ColumnList *columns,physical_index_set_t *bound_columns)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  LogicalType local_40;
  
  ExpressionBinder::ExpressionBinder(&this->super_ExpressionBinder,binder,context,false);
  (this->super_ExpressionBinder)._vptr_ExpressionBinder = (_func_int **)&PTR__CheckBinder_0197d4f0;
  paVar1 = &(this->table).field_2;
  (this->table)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (table_p->_M_dataplus)._M_p;
  paVar2 = &table_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&table_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->table).field_2 + 8) = uVar4;
  }
  else {
    (this->table)._M_dataplus._M_p = pcVar3;
    (this->table).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->table)._M_string_length = table_p->_M_string_length;
  (table_p->_M_dataplus)._M_p = (pointer)paVar2;
  table_p->_M_string_length = 0;
  (table_p->field_2)._M_local_buf[0] = '\0';
  this->columns = columns;
  this->bound_columns = bound_columns;
  LogicalType::LogicalType(&local_40,INTEGER);
  (this->super_ExpressionBinder).target_type.id_ = local_40.id_;
  (this->super_ExpressionBinder).target_type.physical_type_ = local_40.physical_type_;
  peVar5 = (this->super_ExpressionBinder).target_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (this->super_ExpressionBinder).target_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_ExpressionBinder).target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_ExpressionBinder).target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_40.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar5;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var6;
  LogicalType::~LogicalType(&local_40);
  return;
}

Assistant:

CheckBinder::CheckBinder(Binder &binder, ClientContext &context, string table_p, const ColumnList &columns,
                         physical_index_set_t &bound_columns)
    : ExpressionBinder(binder, context), table(std::move(table_p)), columns(columns), bound_columns(bound_columns) {
	target_type = LogicalType::INTEGER;
}